

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-close-order.c
# Opt level: O3

int run_test_close_order(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  int64_t eval_b;
  int64_t eval_a;
  
  uVar2 = uv_default_loop();
  uv_check_init(uVar2,&check_handle);
  uv_check_start(&check_handle,check_cb);
  uv_timer_init(uVar2,&timer_handle1);
  uv_timer_start(&timer_handle1,timer_cb,0,0);
  uv_timer_init(uVar2,&timer_handle2);
  uv_timer_start(&timer_handle2,timer_cb,100000,0);
  if (check_cb_called == 0) {
    if (close_cb_called != 0) goto LAB_00183649;
    if (timer_cb_called != 0) goto LAB_00183656;
    uv_run(uVar2,0);
    if (check_cb_called != 1) goto LAB_00183663;
    if (close_cb_called != 3) goto LAB_00183670;
    if (timer_cb_called != 1) goto LAB_0018367d;
    uv_walk(uVar2,close_walk_cb,0);
    uv_run(uVar2,0);
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_close_order_cold_1();
LAB_00183649:
    run_test_close_order_cold_2();
LAB_00183656:
    run_test_close_order_cold_3();
LAB_00183663:
    run_test_close_order_cold_4();
LAB_00183670:
    run_test_close_order_cold_5();
LAB_0018367d:
    run_test_close_order_cold_6();
  }
  run_test_close_order_cold_7();
  if (check_cb_called == 0) {
    if (timer_cb_called == 0) {
      if (close_cb_called == 0) {
        uv_close();
        iVar1 = uv_close(&timer_handle2,close_cb);
        check_cb_called = check_cb_called + 1;
        return iVar1;
      }
      goto LAB_0018373d;
    }
  }
  else {
    check_cb_cold_1();
  }
  check_cb_cold_2();
LAB_0018373d:
  check_cb_cold_3();
  uv_close();
  timer_cb_called = timer_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(close_order) {
  uv_loop_t* loop;
  loop = uv_default_loop();

  uv_check_init(loop, &check_handle);
  uv_check_start(&check_handle, check_cb);
  uv_timer_init(loop, &timer_handle1);
  uv_timer_start(&timer_handle1, timer_cb, 0, 0);
  uv_timer_init(loop, &timer_handle2);
  uv_timer_start(&timer_handle2, timer_cb, 100000, 0);

  ASSERT_OK(check_cb_called);
  ASSERT_OK(close_cb_called);
  ASSERT_OK(timer_cb_called);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT_EQ(1, check_cb_called);
  ASSERT_EQ(3, close_cb_called);
  ASSERT_EQ(1, timer_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}